

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * sqlite3WindowOffsetExpr(Parse *pParse,Expr *pExpr)

{
  Walker w;
  Walker local_48;
  
  local_48.eCode = '\x01';
  local_48.xExprCallback = exprNodeIsConstant;
  local_48.xSelectCallback = sqlite3SelectWalkFail;
  local_48.u.pNC = local_48.u.pNC & 0xffffffff00000000;
  if (pExpr != (Expr *)0x0) {
    walkExpr(&local_48,pExpr);
  }
  if (local_48.eCode == '\0') {
    if (1 < pParse->eParseMode) {
      local_48.walkerDepth = 0;
      local_48.eCode = '\0';
      local_48._37_3_ = 0;
      local_48.u.pNC = (NameContext *)0x0;
      local_48.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
      local_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_48.xExprCallback = renameUnmapExprCb;
      local_48.pParse = pParse;
      if (pExpr != (Expr *)0x0) {
        walkExpr(&local_48,pExpr);
      }
    }
    if (pExpr != (Expr *)0x0) {
      sqlite3ExprDeleteNN(pParse->db,pExpr);
    }
    pExpr = (Expr *)sqlite3DbMallocRawNN(pParse->db,0x48);
    if (pExpr != (Expr *)0x0) {
      pExpr->op = '\0';
      pExpr->affinity = '\0';
      *(undefined2 *)&pExpr->field_0x2 = 0;
      pExpr->flags = 0;
      (pExpr->u).zToken = (char *)0x0;
      pExpr->iColumn = 0;
      pExpr->iAgg = 0;
      pExpr->iRightJoinTable = 0;
      pExpr->op2 = '\0';
      pExpr->field_0x37 = 0;
      pExpr->pAggInfo = (AggInfo *)0x0;
      (pExpr->x).pList = (ExprList *)0x0;
      pExpr->nHeight = 0;
      pExpr->iTable = 0;
      pExpr->pLeft = (Expr *)0x0;
      pExpr->pRight = (Expr *)0x0;
      (pExpr->y).pTab = (Table *)0x0;
      pExpr->op = 'r';
      pExpr->iAgg = -1;
      pExpr->nHeight = 1;
    }
  }
  return pExpr;
}

Assistant:

static Expr *sqlite3WindowOffsetExpr(Parse *pParse, Expr *pExpr){
  if( 0==sqlite3ExprIsConstant(pExpr) ){
    if( IN_RENAME_OBJECT ) sqlite3RenameExprUnmap(pParse, pExpr);
    sqlite3ExprDelete(pParse->db, pExpr);
    pExpr = sqlite3ExprAlloc(pParse->db, TK_NULL, 0, 0);
  }
  return pExpr;
}